

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse2_128_16.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_table_striped_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ushort *puVar1;
  undefined1 (*pauVar2) [16];
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  short sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  parasail_result_t *ppVar17;
  __m128i *palVar18;
  __m128i *ptr;
  int16_t *ptr_00;
  __m128i *ptr_01;
  int iVar19;
  int32_t t;
  char *pcVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  int16_t iVar27;
  uint uVar28;
  char *__format;
  ulong uVar29;
  undefined8 uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  int iVar34;
  ushort uVar35;
  undefined4 uVar36;
  ulong uVar38;
  ushort uVar46;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  undefined1 auVar39 [16];
  undefined4 uVar37;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  ushort uVar45;
  ushort uVar47;
  ushort uVar51;
  undefined1 auVar42 [16];
  __m128i alVar43;
  undefined1 auVar44 [16];
  short sVar52;
  short sVar56;
  ulong uVar53;
  short sVar57;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  undefined1 auVar58 [16];
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  short sVar88;
  __m128i vH;
  __m128i vH_00;
  __m128i *local_188;
  short local_e8;
  short sStack_e6;
  short local_d8;
  short sStack_d6;
  ushort local_98;
  ushort uStack_96;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  __m128i_16_t e;
  __m128i_16_t h;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar20 = "profile";
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar20 = "profile->profile16.score";
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar20 = "profile->matrix";
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar20 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar20 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar20 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar20 = "open";
        }
        else {
          if (-1 < gap) {
            uVar13 = uVar3 - 1;
            uVar26 = (ulong)uVar3 + 7 >> 3;
            uVar38 = (ulong)uVar13 % uVar26;
            uVar28 = -open;
            uVar22 = ppVar5->min;
            iVar16 = -uVar22;
            if (uVar22 != uVar28 && SBORROW4(uVar22,uVar28) == (int)(uVar22 + open) < 0) {
              iVar16 = open;
            }
            iVar34 = ppVar5->max;
            ppVar17 = parasail_result_new_table1((uint)((ulong)uVar3 + 7) & 0x7ffffff8,s2Len);
            if (ppVar17 != (parasail_result_t *)0x0) {
              ppVar17->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar17->flag | 0x8220802;
              local_188 = parasail_memalign___m128i(0x10,uVar26);
              palVar18 = parasail_memalign___m128i(0x10,uVar26);
              ptr = parasail_memalign___m128i(0x10,uVar26);
              ptr_00 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
              auVar39._0_4_ = -(uint)((int)((ulong)local_188 >> 0x20) == 0 && (int)local_188 == 0);
              auVar39._4_4_ = -(uint)((int)palVar18 == 0 && (int)((ulong)palVar18 >> 0x20) == 0);
              auVar39._8_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0 && (int)ptr == 0);
              auVar39._12_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
              iVar19 = movmskps((int)local_188,auVar39);
              if (iVar19 == 0) {
                iVar19 = s2Len + -1;
                uVar21 = 7 - (int)(uVar13 / uVar26);
                auVar39 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar36 = auVar39._0_4_;
                auVar39 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
                uVar37 = auVar39._0_4_;
                uVar14 = iVar16 - 0x7fff;
                auVar39 = pshuflw(ZEXT416(uVar14),ZEXT416(uVar14),0);
                local_d8 = auVar39._0_2_;
                sStack_d6 = auVar39._2_2_;
                auVar40 = ZEXT416(CONCAT22((short)(uVar22 >> 0x10),0x7ffe - (short)iVar34));
                auVar40 = pshuflw(auVar40,auVar40,0);
                auVar41 = pshuflw(ZEXT416(uVar21),ZEXT416(uVar21),0);
                local_e8 = auVar41._0_2_;
                sStack_e6 = auVar41._2_2_;
                lVar23 = (long)(int)uVar28;
                uVar30 = 0xffffffffffff8000;
                for (uVar29 = 0; uVar29 != uVar26; uVar29 = uVar29 + 1) {
                  lVar31 = lVar23;
                  for (lVar32 = 0; lVar32 != 8; lVar32 = lVar32 + 1) {
                    lVar24 = lVar31;
                    if (s1_beg != 0) {
                      lVar24 = 0;
                    }
                    lVar33 = -0x8000;
                    if (-0x8000 < lVar24) {
                      lVar33 = lVar24;
                    }
                    lVar24 = lVar24 - (ulong)(uint)open;
                    if (lVar24 < -0x7fff) {
                      lVar24 = -0x8000;
                    }
                    *(short *)((long)&h + lVar32 * 2) = (short)lVar33;
                    *(short *)((long)&e + lVar32 * 2) = (short)lVar24;
                    lVar31 = lVar31 - uVar26 * (uint)gap;
                  }
                  local_188[uVar29][0] = h.m[0];
                  local_188[uVar29][1] = h.m[1];
                  ptr[uVar29][0] = e.m[0];
                  ptr[uVar29][1] = e.m[1];
                  lVar23 = lVar23 - (ulong)(uint)gap;
                }
                *ptr_00 = 0;
                uVar22 = uVar28;
                for (uVar29 = 1; s2Len + 1 != uVar29; uVar29 = uVar29 + 1) {
                  iVar27 = -0x8000;
                  if (-0x8000 < (int)uVar22) {
                    iVar27 = (int16_t)uVar22;
                  }
                  if (s2_beg != 0) {
                    iVar27 = 0;
                  }
                  ptr_00[uVar29] = iVar27;
                  uVar22 = uVar22 - gap;
                }
                uVar22 = (uint)uVar26;
                uVar29 = 0;
                local_98 = auVar40._0_2_;
                uStack_96 = auVar40._2_2_;
                auVar41._4_2_ = local_d8;
                auVar41._0_4_ = auVar39._0_4_;
                auVar41._6_2_ = sStack_d6;
                auVar41._8_2_ = local_d8;
                auVar41._10_2_ = sStack_d6;
                auVar41._12_2_ = local_d8;
                auVar41._14_2_ = sStack_d6;
                auVar40 = auVar41;
                iVar16 = iVar19;
                uVar72 = local_98;
                uVar73 = uStack_96;
                uVar74 = local_98;
                uVar75 = uStack_96;
                uVar76 = local_98;
                uVar77 = uStack_96;
                uVar78 = local_98;
                uVar79 = uStack_96;
                do {
                  ptr_01 = palVar18;
                  if (uVar29 == (uint)s2Len) {
                    if (s2_end != 0) {
                      iVar34 = 0;
                      while( true ) {
                        uVar26 = auVar41._0_8_;
                        lVar23 = auVar41._8_8_;
                        if ((int)uVar21 <= iVar34) break;
                        auVar41._0_8_ = uVar26 << 0x10;
                        auVar41._8_8_ = lVar23 << 0x10 | uVar26 >> 0x30;
                        iVar34 = iVar34 + 1;
                      }
                      uVar14 = (uint)auVar41._14_2_;
                    }
                    uVar35 = (ushort)uVar14;
                    uVar28 = uVar13;
                    if (s1_end != 0) {
                      uVar26 = 0;
                      while( true ) {
                        uVar35 = (ushort)uVar14;
                        if ((uVar22 & 0xfffffff) << 3 == (uint)uVar26) break;
                        uVar15 = ((uint)uVar26 & 7) * uVar22 + ((uint)(uVar26 >> 3) & 0x1fffffff);
                        if ((int)uVar15 < (int)uVar3) {
                          uVar45 = *(ushort *)((long)*local_188 + uVar26 * 2);
                          if ((short)uVar35 < (short)uVar45) {
                            uVar14 = (uint)uVar45;
                            iVar16 = iVar19;
                            uVar28 = uVar15;
                          }
                          else {
                            if ((int)uVar28 <= (int)uVar15) {
                              uVar15 = uVar28;
                            }
                            if (iVar16 != iVar19) {
                              uVar15 = uVar28;
                            }
                            if (uVar45 == uVar35) {
                              uVar28 = uVar15;
                            }
                          }
                        }
                        uVar26 = uVar26 + 1;
                      }
                    }
                    if (s2_end == 0 && s1_end == 0) {
                      alVar43 = local_188[uVar38];
                      iVar16 = 0;
                      while( true ) {
                        uVar38 = alVar43[0];
                        lVar23 = alVar43[1];
                        if ((int)uVar21 <= iVar16) break;
                        alVar43[0] = uVar38 << 0x10;
                        alVar43[1] = lVar23 << 0x10 | uVar38 >> 0x30;
                        iVar16 = iVar16 + 1;
                      }
                      uVar35 = alVar43[1]._6_2_;
                      uVar28 = uVar13;
                      iVar16 = iVar19;
                    }
                    auVar44._0_2_ = -(ushort)((short)uVar72 < local_d8);
                    auVar44._2_2_ = -(ushort)((short)uVar73 < sStack_d6);
                    auVar44._4_2_ = -(ushort)((short)uVar74 < local_d8);
                    auVar44._6_2_ = -(ushort)((short)uVar75 < sStack_d6);
                    auVar44._8_2_ = -(ushort)((short)uVar76 < local_d8);
                    auVar44._10_2_ = -(ushort)((short)uVar77 < sStack_d6);
                    auVar44._12_2_ = -(ushort)((short)uVar78 < local_d8);
                    auVar44._14_2_ = -(ushort)((short)uVar79 < sStack_d6);
                    auVar58._0_2_ = -(ushort)((short)local_98 < auVar40._0_2_);
                    auVar58._2_2_ = -(ushort)((short)uStack_96 < auVar40._2_2_);
                    auVar58._4_2_ = -(ushort)((short)local_98 < auVar40._4_2_);
                    auVar58._6_2_ = -(ushort)((short)uStack_96 < auVar40._6_2_);
                    auVar58._8_2_ = -(ushort)((short)local_98 < auVar40._8_2_);
                    auVar58._10_2_ = -(ushort)((short)uStack_96 < auVar40._10_2_);
                    auVar58._12_2_ = -(ushort)((short)local_98 < auVar40._12_2_);
                    auVar58._14_2_ = -(ushort)((short)uStack_96 < auVar40._14_2_);
                    auVar58 = auVar58 | auVar44;
                    if ((((((((((((((((auVar58 >> 7 & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar58 >> 0xf & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar58 >> 0x17 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                   (auVar58 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar58 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar58 >> 0x2f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar58 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar58 >> 0x47 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar58 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar58 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar58 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar58 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar58 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar58[0xf] < '\0') {
                      *(byte *)&ppVar17->flag = (byte)ppVar17->flag | 0x40;
                      uVar35 = 0;
                      iVar16 = 0;
                      uVar28 = 0;
                    }
                    ppVar17->score = (int)(short)uVar35;
                    ppVar17->end_query = uVar28;
                    ppVar17->end_ref = iVar16;
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(ptr_01);
                    parasail_free(local_188);
                    return ppVar17;
                  }
                  uVar25 = local_188[uVar22 - 1][0];
                  iVar34 = ppVar5->mapper[(byte)s2[uVar29]];
                  auVar81._8_8_ = local_188[uVar22 - 1][1] << 0x10 | uVar25 >> 0x30;
                  auVar81._0_8_ = uVar25 << 0x10 | (ulong)(ushort)ptr_00[uVar29];
                  lVar23 = 0;
                  auVar54._4_2_ = local_d8;
                  auVar54._0_4_ = auVar39._0_4_;
                  auVar54._6_2_ = sStack_d6;
                  auVar54._8_2_ = local_d8;
                  auVar54._10_2_ = sStack_d6;
                  auVar54._12_2_ = local_d8;
                  auVar54._14_2_ = sStack_d6;
                  for (uVar25 = 0; t = (int32_t)uVar29, uVar26 != uVar25; uVar25 = uVar25 + 1) {
                    auVar80 = paddsw(auVar81,*(undefined1 (*) [16])
                                              ((long)pvVar4 +
                                              lVar23 + (long)(int)(iVar34 * uVar22) * 0x10));
                    pauVar2 = (undefined1 (*) [16])((long)*ptr + lVar23);
                    sVar82 = *(short *)*pauVar2;
                    sVar83 = *(short *)(*pauVar2 + 2);
                    sVar84 = *(short *)(*pauVar2 + 4);
                    sVar85 = *(short *)(*pauVar2 + 6);
                    sVar86 = *(short *)(*pauVar2 + 8);
                    sVar87 = *(short *)(*pauVar2 + 10);
                    sVar88 = *(short *)(*pauVar2 + 0xc);
                    sVar6 = *(short *)(*pauVar2 + 0xe);
                    auVar81 = *pauVar2;
                    sVar56 = auVar54._0_2_;
                    uVar35 = (ushort)(sVar82 < sVar56) * sVar56 |
                             (ushort)(sVar82 >= sVar56) * sVar82;
                    sVar61 = auVar54._2_2_;
                    uVar45 = (ushort)(sVar83 < sVar61) * sVar61 |
                             (ushort)(sVar83 >= sVar61) * sVar83;
                    sVar63 = auVar54._4_2_;
                    uVar46 = (ushort)(sVar84 < sVar63) * sVar63 |
                             (ushort)(sVar84 >= sVar63) * sVar84;
                    sVar65 = auVar54._6_2_;
                    uVar47 = (ushort)(sVar85 < sVar65) * sVar65 |
                             (ushort)(sVar85 >= sVar65) * sVar85;
                    sVar67 = auVar54._8_2_;
                    uVar48 = (ushort)(sVar86 < sVar67) * sVar67 |
                             (ushort)(sVar86 >= sVar67) * sVar86;
                    sVar69 = auVar54._10_2_;
                    uVar49 = (ushort)(sVar87 < sVar69) * sVar69 |
                             (ushort)(sVar87 >= sVar69) * sVar87;
                    sVar71 = auVar54._12_2_;
                    uVar50 = (ushort)(sVar88 < sVar71) * sVar71 |
                             (ushort)(sVar88 >= sVar71) * sVar88;
                    sVar52 = auVar54._14_2_;
                    uVar51 = (ushort)(sVar6 < sVar52) * sVar52 | (ushort)(sVar6 >= sVar52) * sVar6;
                    sVar57 = auVar80._0_2_;
                    uVar35 = (ushort)((short)uVar35 < sVar57) * sVar57 |
                             ((short)uVar35 >= sVar57) * uVar35;
                    sVar57 = auVar80._2_2_;
                    uVar45 = (ushort)((short)uVar45 < sVar57) * sVar57 |
                             ((short)uVar45 >= sVar57) * uVar45;
                    sVar57 = auVar80._4_2_;
                    uVar46 = (ushort)((short)uVar46 < sVar57) * sVar57 |
                             ((short)uVar46 >= sVar57) * uVar46;
                    sVar57 = auVar80._6_2_;
                    uVar47 = (ushort)((short)uVar47 < sVar57) * sVar57 |
                             ((short)uVar47 >= sVar57) * uVar47;
                    sVar57 = auVar80._8_2_;
                    uVar48 = (ushort)((short)uVar48 < sVar57) * sVar57 |
                             ((short)uVar48 >= sVar57) * uVar48;
                    sVar57 = auVar80._10_2_;
                    uVar49 = (ushort)((short)uVar49 < sVar57) * sVar57 |
                             ((short)uVar49 >= sVar57) * uVar49;
                    sVar57 = auVar80._12_2_;
                    uVar50 = (ushort)((short)uVar50 < sVar57) * sVar57 |
                             ((short)uVar50 >= sVar57) * uVar50;
                    sVar57 = auVar80._14_2_;
                    uVar51 = (ushort)((short)uVar51 < sVar57) * sVar57 |
                             ((short)uVar51 >= sVar57) * uVar51;
                    puVar1 = (ushort *)((long)*ptr_01 + lVar23);
                    *puVar1 = uVar35;
                    puVar1[1] = uVar45;
                    puVar1[2] = uVar46;
                    puVar1[3] = uVar47;
                    puVar1[4] = uVar48;
                    puVar1[5] = uVar49;
                    puVar1[6] = uVar50;
                    puVar1[7] = uVar51;
                    sVar57 = auVar40._0_2_;
                    sVar59 = auVar40._2_2_;
                    sVar60 = auVar40._4_2_;
                    sVar62 = auVar40._6_2_;
                    sVar64 = auVar40._8_2_;
                    sVar66 = auVar40._10_2_;
                    sVar68 = auVar40._12_2_;
                    sVar70 = auVar40._14_2_;
                    uVar72 = (ushort)(sVar82 < (short)uVar72) * sVar82 |
                             (sVar82 >= (short)uVar72) * uVar72;
                    uVar73 = (ushort)(sVar83 < (short)uVar73) * sVar83 |
                             (sVar83 >= (short)uVar73) * uVar73;
                    uVar74 = (ushort)(sVar84 < (short)uVar74) * sVar84 |
                             (sVar84 >= (short)uVar74) * uVar74;
                    uVar75 = (ushort)(sVar85 < (short)uVar75) * sVar85 |
                             (sVar85 >= (short)uVar75) * uVar75;
                    uVar76 = (ushort)(sVar86 < (short)uVar76) * sVar86 |
                             (sVar86 >= (short)uVar76) * uVar76;
                    uVar77 = (ushort)(sVar87 < (short)uVar77) * sVar87 |
                             (sVar87 >= (short)uVar77) * uVar77;
                    uVar78 = (ushort)(sVar88 < (short)uVar78) * sVar88 |
                             (sVar88 >= (short)uVar78) * uVar78;
                    uVar79 = (ushort)(sVar6 < (short)uVar79) * sVar6 |
                             (sVar6 >= (short)uVar79) * uVar79;
                    uVar72 = (ushort)(sVar56 < (short)uVar72) * sVar56 |
                             (sVar56 >= (short)uVar72) * uVar72;
                    uVar73 = (ushort)(sVar61 < (short)uVar73) * sVar61 |
                             (sVar61 >= (short)uVar73) * uVar73;
                    uVar74 = (ushort)(sVar63 < (short)uVar74) * sVar63 |
                             (sVar63 >= (short)uVar74) * uVar74;
                    uVar75 = (ushort)(sVar65 < (short)uVar75) * sVar65 |
                             (sVar65 >= (short)uVar75) * uVar75;
                    uVar76 = (ushort)(sVar67 < (short)uVar76) * sVar67 |
                             (sVar67 >= (short)uVar76) * uVar76;
                    uVar77 = (ushort)(sVar69 < (short)uVar77) * sVar69 |
                             (sVar69 >= (short)uVar77) * uVar77;
                    uVar78 = (ushort)(sVar71 < (short)uVar78) * sVar71 |
                             (sVar71 >= (short)uVar78) * uVar78;
                    uVar79 = (ushort)(sVar52 < (short)uVar79) * sVar52 |
                             (sVar52 >= (short)uVar79) * uVar79;
                    uVar72 = ((short)uVar35 < (short)uVar72) * uVar35 |
                             ((short)uVar35 >= (short)uVar72) * uVar72;
                    uVar73 = ((short)uVar45 < (short)uVar73) * uVar45 |
                             ((short)uVar45 >= (short)uVar73) * uVar73;
                    uVar74 = ((short)uVar46 < (short)uVar74) * uVar46 |
                             ((short)uVar46 >= (short)uVar74) * uVar74;
                    uVar75 = ((short)uVar47 < (short)uVar75) * uVar47 |
                             ((short)uVar47 >= (short)uVar75) * uVar75;
                    uVar76 = ((short)uVar48 < (short)uVar76) * uVar48 |
                             ((short)uVar48 >= (short)uVar76) * uVar76;
                    uVar77 = ((short)uVar49 < (short)uVar77) * uVar49 |
                             ((short)uVar49 >= (short)uVar77) * uVar77;
                    uVar78 = ((short)uVar50 < (short)uVar78) * uVar50 |
                             ((short)uVar50 >= (short)uVar78) * uVar78;
                    uVar79 = ((short)uVar51 < (short)uVar79) * uVar51 |
                             ((short)uVar51 >= (short)uVar79) * uVar79;
                    vH[0] = uVar25 & 0xffffffff;
                    vH[1] = uVar26;
                    arr_store_si128(((ppVar17->field_4).rowcols)->score_row,vH,t,s2Len,
                                    (int32_t)uVar30,uVar22);
                    auVar40._2_2_ =
                         (sVar59 < (short)uVar45) * uVar45 |
                         (ushort)(sVar59 >= (short)uVar45) * sVar59;
                    auVar40._0_2_ =
                         (sVar57 < (short)uVar35) * uVar35 |
                         (ushort)(sVar57 >= (short)uVar35) * sVar57;
                    auVar40._4_2_ =
                         (sVar60 < (short)uVar46) * uVar46 |
                         (ushort)(sVar60 >= (short)uVar46) * sVar60;
                    auVar40._6_2_ =
                         (sVar62 < (short)uVar47) * uVar47 |
                         (ushort)(sVar62 >= (short)uVar47) * sVar62;
                    auVar40._8_2_ =
                         (sVar64 < (short)uVar48) * uVar48 |
                         (ushort)(sVar64 >= (short)uVar48) * sVar64;
                    auVar40._10_2_ =
                         (sVar66 < (short)uVar49) * uVar49 |
                         (ushort)(sVar66 >= (short)uVar49) * sVar66;
                    auVar40._12_2_ =
                         (sVar68 < (short)uVar50) * uVar50 |
                         (ushort)(sVar68 >= (short)uVar50) * sVar68;
                    auVar40._14_2_ =
                         (sVar70 < (short)uVar51) * uVar51 |
                         (ushort)(sVar70 >= (short)uVar51) * sVar70;
                    auVar80._2_2_ = uVar45;
                    auVar80._0_2_ = uVar35;
                    auVar80._4_2_ = uVar46;
                    auVar80._6_2_ = uVar47;
                    auVar80._8_2_ = uVar48;
                    auVar80._10_2_ = uVar49;
                    auVar80._12_2_ = uVar50;
                    auVar80._14_2_ = uVar51;
                    auVar11._4_4_ = uVar36;
                    auVar11._0_4_ = uVar36;
                    auVar11._8_4_ = uVar36;
                    auVar11._12_4_ = uVar36;
                    auVar80 = psubsw(auVar80,auVar11);
                    auVar9._4_4_ = uVar37;
                    auVar9._0_4_ = uVar37;
                    auVar9._8_4_ = uVar37;
                    auVar9._12_4_ = uVar37;
                    auVar81 = psubsw(auVar81,auVar9);
                    sVar56 = auVar80._0_2_;
                    sVar52 = auVar81._0_2_;
                    sVar57 = auVar80._2_2_;
                    sVar82 = auVar81._2_2_;
                    sVar61 = auVar80._4_2_;
                    sVar83 = auVar81._4_2_;
                    sVar63 = auVar80._6_2_;
                    sVar84 = auVar81._6_2_;
                    sVar65 = auVar80._8_2_;
                    sVar85 = auVar81._8_2_;
                    sVar67 = auVar80._10_2_;
                    sVar86 = auVar81._10_2_;
                    sVar69 = auVar80._12_2_;
                    sVar87 = auVar81._12_2_;
                    sVar88 = auVar81._14_2_;
                    sVar71 = auVar80._14_2_;
                    puVar1 = (ushort *)((long)*ptr + lVar23);
                    *puVar1 = (ushort)(sVar52 < sVar56) * sVar56 |
                              (ushort)(sVar52 >= sVar56) * sVar52;
                    puVar1[1] = (ushort)(sVar82 < sVar57) * sVar57 |
                                (ushort)(sVar82 >= sVar57) * sVar82;
                    puVar1[2] = (ushort)(sVar83 < sVar61) * sVar61 |
                                (ushort)(sVar83 >= sVar61) * sVar83;
                    puVar1[3] = (ushort)(sVar84 < sVar63) * sVar63 |
                                (ushort)(sVar84 >= sVar63) * sVar84;
                    puVar1[4] = (ushort)(sVar85 < sVar65) * sVar65 |
                                (ushort)(sVar85 >= sVar65) * sVar85;
                    puVar1[5] = (ushort)(sVar86 < sVar67) * sVar67 |
                                (ushort)(sVar86 >= sVar67) * sVar86;
                    puVar1[6] = (ushort)(sVar87 < sVar69) * sVar69 |
                                (ushort)(sVar87 >= sVar69) * sVar87;
                    puVar1[7] = (ushort)(sVar88 < sVar71) * sVar71 |
                                (ushort)(sVar88 >= sVar71) * sVar88;
                    auVar81 = psubsw(auVar54,auVar9);
                    sVar52 = auVar81._0_2_;
                    auVar54._0_2_ =
                         (ushort)(sVar52 < sVar56) * sVar56 | (ushort)(sVar52 >= sVar56) * sVar52;
                    sVar56 = auVar81._2_2_;
                    auVar54._2_2_ =
                         (ushort)(sVar56 < sVar57) * sVar57 | (ushort)(sVar56 >= sVar57) * sVar56;
                    sVar56 = auVar81._4_2_;
                    auVar54._4_2_ =
                         (ushort)(sVar56 < sVar61) * sVar61 | (ushort)(sVar56 >= sVar61) * sVar56;
                    sVar56 = auVar81._6_2_;
                    auVar54._6_2_ =
                         (ushort)(sVar56 < sVar63) * sVar63 | (ushort)(sVar56 >= sVar63) * sVar56;
                    sVar56 = auVar81._8_2_;
                    auVar54._8_2_ =
                         (ushort)(sVar56 < sVar65) * sVar65 | (ushort)(sVar56 >= sVar65) * sVar56;
                    sVar56 = auVar81._10_2_;
                    auVar54._10_2_ =
                         (ushort)(sVar56 < sVar67) * sVar67 | (ushort)(sVar56 >= sVar67) * sVar56;
                    sVar56 = auVar81._12_2_;
                    sVar57 = auVar81._14_2_;
                    auVar54._12_2_ =
                         (ushort)(sVar56 < sVar69) * sVar69 | (ushort)(sVar56 >= sVar69) * sVar56;
                    auVar54._14_2_ =
                         (ushort)(sVar57 < sVar71) * sVar71 | (ushort)(sVar57 >= sVar71) * sVar57;
                    auVar81 = *(undefined1 (*) [16])((long)*local_188 + lVar23);
                    lVar23 = lVar23 + 0x10;
                  }
                  for (iVar34 = 0; iVar34 != 8; iVar34 = iVar34 + 1) {
                    uVar15 = uVar28;
                    if (s2_beg == 0) {
                      uVar15 = ptr_00[uVar29 + 1] - open;
                    }
                    uVar25 = (ulong)uVar15;
                    if ((int)uVar15 < -0x7fff) {
                      uVar25 = 0xffff8000;
                    }
                    uVar53 = auVar54._0_8_;
                    auVar54._8_8_ = auVar54._8_8_ << 0x10 | uVar53 >> 0x30;
                    auVar54._0_8_ = uVar53 << 0x10 | uVar25 & 0xffff;
                    uVar25 = 0;
                    palVar18 = ptr_01;
                    while (uVar26 != uVar25) {
                      sVar57 = (short)(*palVar18)[0];
                      sVar61 = *(short *)((long)*palVar18 + 2);
                      sVar63 = *(short *)((long)*palVar18 + 4);
                      sVar65 = *(short *)((long)*palVar18 + 6);
                      sVar67 = (short)(*palVar18)[1];
                      sVar69 = *(short *)((long)*palVar18 + 10);
                      sVar71 = *(short *)((long)*palVar18 + 0xc);
                      sVar52 = *(short *)((long)*palVar18 + 0xe);
                      sVar56 = auVar54._0_2_;
                      uVar35 = (ushort)(sVar57 < sVar56) * sVar56 |
                               (ushort)(sVar57 >= sVar56) * sVar57;
                      sVar56 = auVar54._2_2_;
                      uVar45 = (ushort)(sVar61 < sVar56) * sVar56 |
                               (ushort)(sVar61 >= sVar56) * sVar61;
                      sVar56 = auVar54._4_2_;
                      uVar46 = (ushort)(sVar63 < sVar56) * sVar56 |
                               (ushort)(sVar63 >= sVar56) * sVar63;
                      sVar56 = auVar54._6_2_;
                      uVar47 = (ushort)(sVar65 < sVar56) * sVar56 |
                               (ushort)(sVar65 >= sVar56) * sVar65;
                      sVar56 = auVar54._8_2_;
                      uVar48 = (ushort)(sVar67 < sVar56) * sVar56 |
                               (ushort)(sVar67 >= sVar56) * sVar67;
                      sVar56 = auVar54._10_2_;
                      uVar49 = (ushort)(sVar69 < sVar56) * sVar56 |
                               (ushort)(sVar69 >= sVar56) * sVar69;
                      sVar56 = auVar54._12_2_;
                      uVar50 = (ushort)(sVar71 < sVar56) * sVar56 |
                               (ushort)(sVar71 >= sVar56) * sVar71;
                      sVar56 = auVar54._14_2_;
                      uVar51 = (ushort)(sVar52 < sVar56) * sVar56 |
                               (ushort)(sVar52 >= sVar56) * sVar52;
                      *(ushort *)*palVar18 = uVar35;
                      *(ushort *)((long)*palVar18 + 2) = uVar45;
                      *(ushort *)((long)*palVar18 + 4) = uVar46;
                      *(ushort *)((long)*palVar18 + 6) = uVar47;
                      *(ushort *)(*palVar18 + 1) = uVar48;
                      *(ushort *)((long)*palVar18 + 10) = uVar49;
                      *(ushort *)((long)*palVar18 + 0xc) = uVar50;
                      *(ushort *)((long)*palVar18 + 0xe) = uVar51;
                      uVar72 = ((short)uVar35 < (short)uVar72) * uVar35 |
                               ((short)uVar35 >= (short)uVar72) * uVar72;
                      uVar73 = ((short)uVar45 < (short)uVar73) * uVar45 |
                               ((short)uVar45 >= (short)uVar73) * uVar73;
                      uVar74 = ((short)uVar46 < (short)uVar74) * uVar46 |
                               ((short)uVar46 >= (short)uVar74) * uVar74;
                      uVar75 = ((short)uVar47 < (short)uVar75) * uVar47 |
                               ((short)uVar47 >= (short)uVar75) * uVar75;
                      uVar76 = ((short)uVar48 < (short)uVar76) * uVar48 |
                               ((short)uVar48 >= (short)uVar76) * uVar76;
                      uVar77 = ((short)uVar49 < (short)uVar77) * uVar49 |
                               ((short)uVar49 >= (short)uVar77) * uVar77;
                      uVar78 = ((short)uVar50 < (short)uVar78) * uVar50 |
                               ((short)uVar50 >= (short)uVar78) * uVar78;
                      uVar79 = ((short)uVar51 < (short)uVar79) * uVar51 |
                               ((short)uVar51 >= (short)uVar79) * uVar79;
                      sVar56 = auVar40._0_2_;
                      sVar57 = auVar40._2_2_;
                      sVar61 = auVar40._4_2_;
                      sVar63 = auVar40._6_2_;
                      sVar65 = auVar40._8_2_;
                      sVar67 = auVar40._10_2_;
                      sVar69 = auVar40._12_2_;
                      sVar71 = auVar40._14_2_;
                      vH_00[0] = uVar25 & 0xffffffff;
                      vH_00[1] = uVar26;
                      arr_store_si128(((ppVar17->field_4).rowcols)->score_row,vH_00,t,s2Len,
                                      (int32_t)uVar30,uVar22);
                      auVar40._2_2_ =
                           (sVar57 < (short)uVar45) * uVar45 |
                           (ushort)(sVar57 >= (short)uVar45) * sVar57;
                      auVar40._0_2_ =
                           (sVar56 < (short)uVar35) * uVar35 |
                           (ushort)(sVar56 >= (short)uVar35) * sVar56;
                      auVar40._4_2_ =
                           (sVar61 < (short)uVar46) * uVar46 |
                           (ushort)(sVar61 >= (short)uVar46) * sVar61;
                      auVar40._6_2_ =
                           (sVar63 < (short)uVar47) * uVar47 |
                           (ushort)(sVar63 >= (short)uVar47) * sVar63;
                      auVar40._8_2_ =
                           (sVar65 < (short)uVar48) * uVar48 |
                           (ushort)(sVar65 >= (short)uVar48) * sVar65;
                      auVar40._10_2_ =
                           (sVar67 < (short)uVar49) * uVar49 |
                           (ushort)(sVar67 >= (short)uVar49) * sVar67;
                      auVar40._12_2_ =
                           (sVar69 < (short)uVar50) * uVar50 |
                           (ushort)(sVar69 >= (short)uVar50) * sVar69;
                      auVar40._14_2_ =
                           (sVar71 < (short)uVar51) * uVar51 |
                           (ushort)(sVar71 >= (short)uVar51) * sVar71;
                      auVar7._2_2_ = uVar45;
                      auVar7._0_2_ = uVar35;
                      auVar7._4_2_ = uVar46;
                      auVar7._6_2_ = uVar47;
                      auVar7._8_2_ = uVar48;
                      auVar7._10_2_ = uVar49;
                      auVar7._12_2_ = uVar50;
                      auVar7._14_2_ = uVar51;
                      auVar12._4_4_ = uVar36;
                      auVar12._0_4_ = uVar36;
                      auVar12._8_4_ = uVar36;
                      auVar12._12_4_ = uVar36;
                      auVar81 = psubsw(auVar7,auVar12);
                      auVar10._4_4_ = uVar37;
                      auVar10._0_4_ = uVar37;
                      auVar10._8_4_ = uVar37;
                      auVar10._12_4_ = uVar37;
                      auVar54 = psubsw(auVar54,auVar10);
                      auVar42._0_2_ = -(ushort)(auVar81._0_2_ < auVar54._0_2_);
                      auVar42._2_2_ = -(ushort)(auVar81._2_2_ < auVar54._2_2_);
                      auVar42._4_2_ = -(ushort)(auVar81._4_2_ < auVar54._4_2_);
                      auVar42._6_2_ = -(ushort)(auVar81._6_2_ < auVar54._6_2_);
                      auVar42._8_2_ = -(ushort)(auVar81._8_2_ < auVar54._8_2_);
                      auVar42._10_2_ = -(ushort)(auVar81._10_2_ < auVar54._10_2_);
                      auVar42._12_2_ = -(ushort)(auVar81._12_2_ < auVar54._12_2_);
                      auVar42._14_2_ = -(ushort)(auVar81._14_2_ < auVar54._14_2_);
                      uVar25 = uVar25 + 1;
                      palVar18 = palVar18 + 1;
                      if ((((((((((((((((auVar42 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar42 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar42 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar42 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar42 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar42 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar42 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar42 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar42 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar42 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar42 >> 0x57 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar42 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar42 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar42 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar42._14_2_ >> 7 & 1) == 0) && (auVar42._14_2_ & 0x8000) == 0)
                      goto LAB_00566ad3;
                    }
                  }
LAB_00566ad3:
                  palVar18 = ptr_01 + uVar38;
                  sVar56 = (short)(*palVar18)[0];
                  sVar57 = *(short *)((long)*palVar18 + 2);
                  sVar61 = *(short *)((long)*palVar18 + 4);
                  sVar63 = *(short *)((long)*palVar18 + 6);
                  sVar65 = (short)(*palVar18)[1];
                  sVar67 = *(short *)((long)*palVar18 + 10);
                  sVar69 = *(short *)((long)*palVar18 + 0xc);
                  sVar71 = *(short *)((long)*palVar18 + 0xe);
                  local_68 = auVar41._0_2_;
                  sStack_66 = auVar41._2_2_;
                  sStack_64 = auVar41._4_2_;
                  sStack_62 = auVar41._6_2_;
                  sStack_60 = auVar41._8_2_;
                  sStack_5e = auVar41._10_2_;
                  sStack_5c = auVar41._12_2_;
                  sStack_5a = auVar41._14_2_;
                  auVar55._0_2_ = -(ushort)(local_68 < sVar56);
                  auVar55._2_2_ = -(ushort)(sStack_66 < sVar57);
                  auVar55._4_2_ = -(ushort)(sStack_64 < sVar61);
                  auVar55._6_2_ = -(ushort)(sStack_62 < sVar63);
                  auVar55._8_2_ = -(ushort)(sStack_60 < sVar65);
                  auVar55._10_2_ = -(ushort)(sStack_5e < sVar67);
                  auVar55._12_2_ = -(ushort)(sStack_5c < sVar69);
                  auVar55._14_2_ = -(ushort)(sStack_5a < sVar71);
                  auVar8._2_2_ = -(ushort)(sStack_e6 == 6);
                  auVar8._0_2_ = -(ushort)(local_e8 == 7);
                  auVar8._4_2_ = -(ushort)(local_e8 == 5);
                  auVar8._6_2_ = -(ushort)(sStack_e6 == 4);
                  auVar8._8_2_ = -(ushort)(local_e8 == 3);
                  auVar8._10_2_ = -(ushort)(sStack_e6 == 2);
                  auVar8._12_2_ = -(ushort)(local_e8 == 1);
                  auVar8._14_2_ = -(ushort)(sStack_e6 == 0);
                  auVar55 = auVar55 & auVar8;
                  if ((((((((((((((((auVar55 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar55 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar55 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar55 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar55 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar55 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar55 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar55 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar55 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar55 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar55 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar55 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar55 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar55[0xf] < '\0') {
                    iVar16 = t;
                  }
                  auVar41._0_2_ =
                       (ushort)(local_68 < sVar56) * sVar56 |
                       (ushort)(local_68 >= sVar56) * local_68;
                  auVar41._2_2_ =
                       (ushort)(sStack_66 < sVar57) * sVar57 |
                       (ushort)(sStack_66 >= sVar57) * sStack_66;
                  auVar41._4_2_ =
                       (ushort)(sStack_64 < sVar61) * sVar61 |
                       (ushort)(sStack_64 >= sVar61) * sStack_64;
                  auVar41._6_2_ =
                       (ushort)(sStack_62 < sVar63) * sVar63 |
                       (ushort)(sStack_62 >= sVar63) * sStack_62;
                  auVar41._8_2_ =
                       (ushort)(sStack_60 < sVar65) * sVar65 |
                       (ushort)(sStack_60 >= sVar65) * sStack_60;
                  auVar41._10_2_ =
                       (ushort)(sStack_5e < sVar67) * sVar67 |
                       (ushort)(sStack_5e >= sVar67) * sStack_5e;
                  auVar41._12_2_ =
                       (ushort)(sStack_5c < sVar69) * sVar69 |
                       (ushort)(sStack_5c >= sVar69) * sStack_5c;
                  auVar41._14_2_ =
                       (ushort)(sStack_5a < sVar71) * sVar71 |
                       (ushort)(sStack_5a >= sVar71) * sStack_5a;
                  uVar29 = uVar29 + 1;
                  palVar18 = local_188;
                  local_188 = ptr_01;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar20 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_table_striped_profile_sse2_128_16",pcVar20);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi16(_mm_set1_epi16(position),
            _mm_set_epi16(0,1,2,3,4,5,6,7));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 2);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi16(vH, vGapO);
            vE = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi16(vH, vGapO);
                vF = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm_max_epi16(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi16(vH, vMaxH));
            vMaxH = _mm_max_epi16(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 2);
        }
        score = (int16_t) _mm_extract_epi16(vMaxH, 7);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            score = (int16_t) _mm_extract_epi16 (vH, 7);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}